

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

void __thiscall
booster::aio::stream_socket::async_read_some
          (stream_socket *this,mutable_buffer *buffer,io_handler *h)

{
  bool bVar1;
  reader_some *p;
  basic_io_device *in_RDI;
  pointer reader;
  size_t n;
  error_code e;
  event_handler *in_stack_ffffffffffffff88;
  error_code *in_stack_ffffffffffffff90;
  basic_io_device *this_00;
  io_handler *in_stack_ffffffffffffff98;
  stream_socket *in_stack_ffffffffffffffa8;
  mutable_buffer *in_stack_ffffffffffffffb0;
  stream_socket *in_stack_ffffffffffffffb8;
  reader_some *in_stack_ffffffffffffffc0;
  undefined1 local_38 [56];
  
  bVar1 = basic_io_device::dont_block
                    ((basic_io_device *)in_stack_ffffffffffffffa8,(io_handler *)in_RDI);
  if (bVar1) {
    std::error_code::error_code(in_stack_ffffffffffffff90);
    local_38._8_8_ =
         read_some(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   (error_code *)in_stack_ffffffffffffffa8);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)(local_38 + 0x10));
    if ((bVar1) && (bVar1 = basic_io_device::would_block(in_stack_ffffffffffffff90), bVar1)) {
      p = (reader_some *)operator_new(0x50);
      anon_unknown_15::reader_some::reader_some
                (in_stack_ffffffffffffffc0,(io_handler *)in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      this_00 = (basic_io_device *)local_38;
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some>::intrusive_ptr
                ((intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some> *)in_RDI,p,
                 SUB81((ulong)this_00 >> 0x38,0));
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some>::intrusive_ptr
                ((intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some> *)this_00,
                 (intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some> *)
                 in_stack_ffffffffffffff88);
      callback<void_(const_std::error_code_&)>::
      callback<booster::aio::(anonymous_namespace)::reader_some>
                ((callback<void_(const_std::error_code_&)> *)this_00,
                 (intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some> *)
                 in_stack_ffffffffffffff88);
      basic_io_device::on_readable(this_00,in_stack_ffffffffffffff88);
      callback<void_(const_std::error_code_&)>::~callback
                ((callback<void_(const_std::error_code_&)> *)0x21a6ea);
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some>::~intrusive_ptr
                ((intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some> *)this_00);
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some>::~intrusive_ptr
                ((intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some> *)this_00);
    }
    else {
      basic_io_device::get_io_service(in_RDI);
      io_service::post((io_service *)in_RDI,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                       (size_t)in_stack_ffffffffffffff88);
    }
  }
  return;
}

Assistant:

void stream_socket::async_read_some(mutable_buffer const &buffer,io_handler const &h)
{
	if(!dont_block(h))
		return;
	#ifdef BOOSTER_AIO_FORCE_POLL
	reader_some::pointer reader(new reader_some(h,buffer,this));
	on_readable(reader);
	#else
	system::error_code e;
	size_t n = read_some(buffer,e);
	if(e &&  would_block(e)) {
		reader_some::pointer reader(new reader_some(h,buffer,this));
		on_readable(reader);
	}
	else {
		get_io_service().post(h,e,n);
	}
	#endif
}